

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool google::protobuf::internal::IsDescendant(Message *root,Message *message)

{
  FieldDescriptor *this;
  bool bVar1;
  CppType CVar2;
  int iVar3;
  reference ppFVar4;
  Message *pMVar5;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  MapValueRef *this_02;
  Message *sub_message_2;
  MapIterator iter;
  MapIterator end;
  FieldDescriptor *val_field;
  int kValIdx;
  Message *sub_message_1;
  int i;
  int count;
  Message *sub_message;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  Message *message_local;
  Message *root_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Message::GetReflection(root);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_40);
  Reflection::ListFields
            ((Reflection *)
             fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,root,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_40);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_40);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_40);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      root_local._7_1_ = false;
LAB_0046e880:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_40);
      return root_local._7_1_;
    }
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    this = *ppFVar4;
    CVar2 = FieldDescriptor::cpp_type(this);
    if (CVar2 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_repeated(this);
      if (bVar1) {
        bVar1 = anon_unknown_6::IsMapFieldInApi(this);
        if (bVar1) {
          this_00 = FieldDescriptor::message_type(this);
          this_01 = Descriptor::field(this_00,1);
          CVar2 = FieldDescriptor::cpp_type(this_01);
          if (CVar2 == CPPTYPE_MESSAGE) {
            Reflection::MapEnd((MapIterator *)&iter.value_.super_MapValueConstRef.type_,
                               (Reflection *)
                               fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,root,this);
            Reflection::MapBegin
                      ((MapIterator *)&sub_message_2,
                       (Reflection *)
                       fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,root,this);
            while (bVar1 = protobuf::operator!=
                                     ((MapIterator *)&sub_message_2,
                                      (MapIterator *)&iter.value_.super_MapValueConstRef.type_),
                  bVar1) {
              this_02 = MapIterator::MutableValueRef((MapIterator *)&sub_message_2);
              pMVar5 = MapValueRef::MutableMessageValue(this_02);
              if ((pMVar5 == message) || (bVar1 = IsDescendant(pMVar5,message), bVar1)) {
                root_local._7_1_ = true;
                goto LAB_0046e880;
              }
              MapIterator::operator++((MapIterator *)&sub_message_2);
            }
          }
        }
        else {
          iVar3 = Reflection::FieldSize
                            ((Reflection *)
                             fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,root,this);
          for (sub_message_1._4_4_ = 0; sub_message_1._4_4_ < iVar3;
              sub_message_1._4_4_ = sub_message_1._4_4_ + 1) {
            pMVar5 = Reflection::MutableRepeatedMessage
                               ((Reflection *)
                                fields.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,root,this,
                                sub_message_1._4_4_);
            if ((pMVar5 == message) || (bVar1 = IsDescendant(pMVar5,message), bVar1)) {
              root_local._7_1_ = true;
              goto LAB_0046e880;
            }
          }
        }
      }
      else {
        pMVar5 = Reflection::MutableMessage
                           ((Reflection *)
                            fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,root,this,
                            (MessageFactory *)0x0);
        if ((pMVar5 == message) || (bVar1 = IsDescendant(pMVar5,message), bVar1)) {
          root_local._7_1_ = true;
          goto LAB_0046e880;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool IsDescendant(Message& root, const Message& message) {
  const Reflection* reflection = root.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(root, &fields);

  for (const auto* field : fields) {
    // Skip non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    // Optional messages.
    if (!field->is_repeated()) {
      Message* sub_message = reflection->MutableMessage(&root, field);
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
      continue;
    }

    // Repeated messages.
    if (!IsMapFieldInApi(field)) {
      int count = reflection->FieldSize(root, field);
      for (int i = 0; i < count; i++) {
        Message* sub_message =
            reflection->MutableRepeatedMessage(&root, field, i);
        if (sub_message == &message || IsDescendant(*sub_message, message)) {
          return true;
        }
      }
      continue;
    }

    // Map field: if accessed as repeated fields, messages are *copied* and
    // matching pointer won't work. Must directly access map.
    constexpr int kValIdx = 1;
    const FieldDescriptor* val_field = field->message_type()->field(kValIdx);
    // Skip map fields whose value type is not message.
    if (val_field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    MapIterator end = reflection->MapEnd(&root, field);
    for (auto iter = reflection->MapBegin(&root, field); iter != end; ++iter) {
      Message* sub_message = iter.MutableValueRef()->MutableMessageValue();
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
    }
  }

  return false;
}